

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

bool units::hasAdditionalOps(string *unit_string)

{
  ulong uVar1;
  long lVar2;
  bool bVar3;
  
  uVar1 = std::__cxx11::string::rfind((char)unit_string,0x7b);
  lVar2 = std::__cxx11::string::find_last_of((char *)unit_string,0x17d8ce,uVar1);
  bVar3 = true;
  if (lVar2 == -1) {
    uVar1 = std::__cxx11::string::rfind((char)unit_string,0x7d);
    lVar2 = std::__cxx11::string::find_first_of((char *)unit_string,0x17d8ce,uVar1);
    bVar3 = lVar2 != -1;
  }
  return bVar3;
}

Assistant:

static bool hasAdditionalOps(const std::string& unit_string)
{
    return (unit_string.find_last_of("*^(/", unit_string.find_last_of('{')) !=
            std::string::npos) ||
        (unit_string.find_first_of("*^(/", unit_string.find_last_of('}')) !=
         std::string::npos);
}